

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_tmpfile.h
# Opt level: O2

int fio_tmpfile(void)

{
  int iVar1;
  char name_template [31];
  char acStack_28 [40];
  
  builtin_strncpy(acStack_28,"/tmp/facil_io_tmpfile_XXXXXXXX",0x1f);
  iVar1 = mkstemp(acStack_28);
  return iVar1;
}

Assistant:

static inline int fio_tmpfile(void) {
  // create a temporary file to contain the data.
  int fd = 0;
#ifdef P_tmpdir
  if (P_tmpdir[sizeof(P_tmpdir) - 1] == '/') {
    char name_template[] = P_tmpdir "facil_io_tmpfile_XXXXXXXX";
    fd = mkstemp(name_template);
  } else {
    char name_template[] = P_tmpdir "/facil_io_tmpfile_XXXXXXXX";
    fd = mkstemp(name_template);
  }
#else
  char name_template[] = "/tmp/facil_io_tmpfile_XXXXXXXX";
  fd = mkstemp(name_template);
#endif
  return fd;
}